

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderProgram.cpp
# Opt level: O3

TestLog * glu::operator<<(TestLog *log,Shader *shader)

{
  long *local_68 [2];
  long local_58 [2];
  long *local_48;
  long local_40;
  long local_38 [2];
  
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Plain shader","");
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char*>((string *)local_68,local_48,local_40 + (long)local_48);
  tcu::TestLog::startShaderProgram(log,false,(char *)local_68[0]);
  operator<<(log,&shader->m_info);
  tcu::TestLog::endShaderProgram(log);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return log;
}

Assistant:

tcu::TestLog& operator<< (tcu::TestLog& log, const Shader& shader)
{
	return log << tcu::TestLog::ShaderProgram(false, "Plain shader") << shader.getInfo() << tcu::TestLog::EndShaderProgram;
}